

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# screen.cpp
# Opt level: O0

void cppurses::detail::Screen::delegate_paint(Widget *widg,Screen_descriptor *staged_tiles)

{
  bool bVar1;
  Screen_state *pSVar2;
  Glyph local_48;
  Glyph *local_30;
  Glyph *current_wallpaper;
  Glyph *previous_wallpaper;
  Optimize *optimization_info;
  Screen_descriptor *staged_tiles_local;
  Widget *widg_local;
  
  optimization_info = (Optimize *)staged_tiles;
  staged_tiles_local = (Screen_descriptor *)widg;
  pSVar2 = Widget::screen_state(widg);
  previous_wallpaper = (Glyph *)&pSVar2->optimize;
  current_wallpaper = &(pSVar2->optimize).wallpaper;
  Widget::generate_wallpaper(&local_48,(Widget *)staged_tiles_local);
  local_30 = &local_48;
  if ((previous_wallpaper->symbol & L'\x01') == L'\0') {
    bVar1 = anon_unknown.dwarf_1a9dcc::has_same_display(local_30,current_wallpaper);
    if (bVar1) {
      if ((previous_wallpaper->symbol & L'Ā') == L'\0') {
        if ((previous_wallpaper->symbol & L'𐀀') == L'\0') {
          if ((previous_wallpaper->symbol & L'\x01000000') == L'\0') {
            basic_paint((Widget *)staged_tiles_local,(Screen_descriptor *)optimization_info);
          }
          else {
            paint_child_event((Widget *)staged_tiles_local,(Screen_descriptor *)optimization_info);
          }
        }
        else {
          full_paint((Widget *)staged_tiles_local,(Screen_descriptor *)optimization_info);
        }
      }
      else {
        paint_move_event((Widget *)staged_tiles_local,(Screen_descriptor *)optimization_info);
      }
    }
    else {
      full_paint((Widget *)staged_tiles_local,(Screen_descriptor *)optimization_info);
    }
  }
  else {
    paint_just_enabled((Widget *)staged_tiles_local,(Screen_descriptor *)optimization_info);
  }
  Screen_state::Optimize::reset((Optimize *)previous_wallpaper);
  Glyph::operator=(current_wallpaper,local_30);
  Glyph::~Glyph(&local_48);
  return;
}

Assistant:

void Screen::delegate_paint(Widget& widg, const Screen_descriptor& staged_tiles)
{
    auto& optimization_info       = widg.screen_state().optimize;
    auto& previous_wallpaper      = optimization_info.wallpaper;
    const auto& current_wallpaper = widg.generate_wallpaper();
    if (optimization_info.just_enabled) {
        paint_just_enabled(widg, staged_tiles);
    }
    else if (!has_same_display(current_wallpaper, previous_wallpaper)) {
        full_paint(widg, staged_tiles);
    }
    else if (optimization_info.moved) {
        paint_move_event(widg, staged_tiles);
    }
    else if (optimization_info.resized) {
        // paint_resize_event(widg, staged_tiles);
        full_paint(widg, staged_tiles);
    }
    else if (optimization_info.child_event) {
        paint_child_event(widg, staged_tiles);
    }
    else {
        basic_paint(widg, staged_tiles);
    }
    optimization_info.reset();
    previous_wallpaper = current_wallpaper;
}